

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Measurement.h
# Opt level: O0

void __thiscall LidarMeasurement::~LidarMeasurement(LidarMeasurement *this)

{
  LidarMeasurement *this_local;
  
  ~LidarMeasurement(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~LidarMeasurement() {}